

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

void my_dclose(ang_dir *dir)

{
  if ((DIR *)dir->d != (DIR *)0x0) {
    closedir((DIR *)dir->d);
  }
  mem_free(dir->dirname);
  mem_free(dir);
  return;
}

Assistant:

void my_dclose(ang_dir *dir)
{
	/* Close directory */
	if (dir->d)
		closedir(dir->d);

	/* Free memory */
	mem_free(dir->dirname);
	mem_free(dir);
}